

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangw.c
# Opt level: O0

int parse_rtlist(char *prgname,uchar *rxbuf,int len)

{
  char *pcVar1;
  int in_EDX;
  uint *in_RSI;
  char *in_RDI;
  int rtlen;
  __u32 deleted;
  __u32 dropped;
  __u32 handled;
  uint dst_ifindex;
  uint src_ifindex;
  nlmsghdr *nlh;
  rtattr *rta;
  rtcanmsg *rtc;
  char ifname [16];
  undefined7 in_stack_ffffffffffffff80;
  bool bVar2;
  void *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 uVar3;
  int local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint *local_50;
  uint *local_48;
  void *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  int local_1c;
  
  local_50 = in_RSI;
  local_1c = in_EDX;
  while( true ) {
    if (((local_1c < 0x10) || (*local_50 < 0x10)) || (local_1c < (int)*local_50)) {
      return 0;
    }
    if ((short)local_50[1] == 2) {
      printf("NLMSG_ERROR\n");
      return 1;
    }
    if ((short)local_50[1] == 3) break;
    if ((byte)local_50[4] != 0x1d) {
      printf("received msg from unknown family %d\n",(ulong)(byte)local_50[4]);
      return -0x16;
    }
    if (*(char *)((long)local_50 + 0x11) != '\x01') {
      printf("received msg with unknown gwtype %d\n",(ulong)*(byte *)((long)local_50 + 0x11));
      return -0x16;
    }
    local_5c = 0;
    local_60 = 0;
    local_64 = 0;
    local_54 = 0;
    local_58 = 0;
    pcVar1 = __xpg_basename(in_RDI);
    printf("%s -A ",pcVar1);
    local_48 = local_50 + 5;
    local_68 = *local_50 - 0x14;
    while( true ) {
      uVar3 = false;
      if ((3 < local_68) && (uVar3 = false, 3 < (ushort)*local_48)) {
        uVar3 = (int)(uint)(ushort)*local_48 <= local_68;
      }
      if ((bool)uVar3 == false) break;
      in_stack_ffffffffffffff88 = (void *)(ulong)(*(ushort *)((long)local_48 + 2) - 1);
      switch(in_stack_ffffffffffffff88) {
      case (void *)0x0:
      case (void *)0x1:
      case (void *)0x2:
      case (void *)0x3:
      case (void *)0x4:
      case (void *)0x5:
      case (void *)0xa:
      case (void *)0xc:
      case (void *)0xd:
      case (void *)0xe:
      case (void *)0xf:
      case (void *)0x10:
      case (void *)0x11:
        break;
      case (void *)0x6:
        local_5c = local_48[1];
        break;
      case (void *)0x7:
        local_60 = local_48[1];
        break;
      case (void *)0x8:
        local_54 = local_48[1];
        break;
      case (void *)0x9:
        local_58 = local_48[1];
        break;
      case (void *)0xb:
        local_64 = local_48[1];
        break;
      default:
        printf("Unknown attribute %d!",(ulong)*(ushort *)((long)local_48 + 2));
        return -0x16;
      }
      local_68 = local_68 - ((ushort)*local_48 + 3 & 0xfffffffc);
      local_48 = (uint *)((long)local_48 + (ulong)((ushort)*local_48 + 3 & 0xfffffffc));
    }
    pcVar1 = if_indextoname(local_54,&stack0xffffffffffffffc8);
    printf("-s %s ",pcVar1);
    pcVar1 = if_indextoname(local_58,&stack0xffffffffffffffc8);
    printf("-d %s ",pcVar1);
    if ((*(ushort *)((long)local_50 + 0x12) & 8) != 0) {
      printf("-X ");
    }
    if ((*(ushort *)((long)local_50 + 0x12) & 1) != 0) {
      printf("-e ");
    }
    if ((*(ushort *)((long)local_50 + 0x12) & 2) != 0) {
      printf("-t ");
    }
    if ((*(ushort *)((long)local_50 + 0x12) & 4) != 0) {
      printf("-i ");
    }
    local_48 = local_50 + 5;
    local_68 = *local_50 - 0x14;
    while( true ) {
      bVar2 = false;
      if ((3 < local_68) && (bVar2 = false, 3 < (ushort)*local_48)) {
        bVar2 = (int)(uint)(ushort)*local_48 <= local_68;
      }
      if (bVar2 == false) break;
      switch(*(ushort *)((long)local_48 + 2)) {
      case 1:
        printmod((char *)CONCAT17(uVar3,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88);
        break;
      case 2:
        printmod((char *)CONCAT17(uVar3,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88);
        break;
      case 3:
        printmod((char *)CONCAT17(uVar3,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88);
        break;
      case 4:
        printmod((char *)CONCAT17(uVar3,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88);
        break;
      case 5:
        print_cs_xor((cgw_csum_xor *)0x1029c7);
        break;
      case 6:
        print_cs_crc8((cgw_csum_crc8 *)CONCAT17(bVar2,in_stack_ffffffffffffff80));
        break;
      case 7:
      case 8:
      case 9:
      case 10:
      case 0xc:
        break;
      case 0xb:
        printfilter((void *)CONCAT17(bVar2,in_stack_ffffffffffffff80));
        break;
      case 0xd:
        printf("-l %d ",(ulong)(byte)local_48[1]);
        break;
      case 0xe:
        printf("-u %X ",(ulong)local_48[1]);
        break;
      case 0xf:
        printfdmod(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        break;
      case 0x10:
        printfdmod(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        break;
      case 0x11:
        printfdmod(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        break;
      case 0x12:
        printfdmod(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        break;
      default:
        printf("Unknown attribute %d!",(ulong)*(ushort *)((long)local_48 + 2));
        return -0x16;
      }
      local_68 = local_68 - ((ushort)*local_48 + 3 & 0xfffffffc);
      local_48 = (uint *)((long)local_48 + (ulong)((ushort)*local_48 + 3 & 0xfffffffc));
    }
    printf("# %d handled %d dropped %d deleted\n",(ulong)local_5c,(ulong)local_60,(ulong)local_64);
    local_1c = local_1c - (*local_50 + 3 & 0xfffffffc);
    local_50 = (uint *)((long)local_50 + (ulong)(*local_50 + 3 & 0xfffffffc));
  }
  return 1;
}

Assistant:

int parse_rtlist(char *prgname, unsigned char *rxbuf, int len)
{
	char ifname[IF_NAMESIZE]; /* interface name for if_indextoname() */
	struct rtcanmsg *rtc;
	struct rtattr *rta;
	struct nlmsghdr *nlh;
	unsigned int src_ifindex = 0;
	unsigned int dst_ifindex = 0;
	__u32 handled, dropped, deleted;
	int rtlen;


	nlh = (struct nlmsghdr *)rxbuf;

	while (1) {
		if (!NLMSG_OK(nlh, len))
			return 0;

		if (nlh->nlmsg_type == NLMSG_ERROR) {
			printf("NLMSG_ERROR\n");
			return 1;
		}

		if (nlh->nlmsg_type == NLMSG_DONE) {
			//printf("NLMSG_DONE\n");
			return 1;
		}

		rtc = (struct rtcanmsg *)NLMSG_DATA(nlh);
		if (rtc->can_family != AF_CAN) {
			printf("received msg from unknown family %d\n", rtc->can_family);
			return -EINVAL;
		}

		if (rtc->gwtype != CGW_TYPE_CAN_CAN) {
			printf("received msg with unknown gwtype %d\n", rtc->gwtype);
			return -EINVAL;
		}

		/*
		 * print list in a representation that
		 * can be used directly for start scripts.
		 *
		 * To order the mandatory and optional parameters in the
		 * output string, the NLMSG is parsed twice.
		 */

		handled = 0;
		dropped = 0;
		deleted = 0;
		src_ifindex = 0;
		dst_ifindex = 0;

		printf("%s -A ", basename(prgname));

		/* first parse for mandatory options */
		rta = (struct rtattr *) RTCAN_RTA(rtc);
		rtlen = RTCAN_PAYLOAD(nlh);
		for(;RTA_OK(rta, rtlen);rta=RTA_NEXT(rta,rtlen))
		{
			//printf("(A-%d)", rta->rta_type);
			switch(rta->rta_type) {

			case CGW_FILTER:
			case CGW_MOD_AND:
			case CGW_MOD_OR:
			case CGW_MOD_XOR:
			case CGW_MOD_SET:
			case CGW_FDMOD_AND:
			case CGW_FDMOD_OR:
			case CGW_FDMOD_XOR:
			case CGW_FDMOD_SET:
			case CGW_MOD_UID:
			case CGW_LIM_HOPS:
			case CGW_CS_XOR:
			case CGW_CS_CRC8:
				break;

			case CGW_SRC_IF:
				src_ifindex = *(__u32 *)RTA_DATA(rta);
				break;

			case CGW_DST_IF:
				dst_ifindex = *(__u32 *)RTA_DATA(rta);
				break;

			case CGW_HANDLED:
				handled = *(__u32 *)RTA_DATA(rta);
				break;

			case CGW_DROPPED:
				dropped = *(__u32 *)RTA_DATA(rta);
				break;

			case CGW_DELETED:
				deleted = *(__u32 *)RTA_DATA(rta);
				break;

			default:
				printf("Unknown attribute %d!", rta->rta_type);
				return -EINVAL;
				break;
			}
		}


		printf("-s %s ", if_indextoname(src_ifindex, ifname));
		printf("-d %s ", if_indextoname(dst_ifindex, ifname));

		if (rtc->flags & CGW_FLAGS_CAN_FD)
			printf("-X ");

		if (rtc->flags & CGW_FLAGS_CAN_ECHO)
			printf("-e ");

		if (rtc->flags & CGW_FLAGS_CAN_SRC_TSTAMP)
			printf("-t ");

		if (rtc->flags & CGW_FLAGS_CAN_IIF_TX_OK)
			printf("-i ");

		/* second parse for mod attributes */
		rta = (struct rtattr *) RTCAN_RTA(rtc);
		rtlen = RTCAN_PAYLOAD(nlh);
		for(;RTA_OK(rta, rtlen);rta=RTA_NEXT(rta,rtlen))
		{
			//printf("(B-%d)", rta->rta_type);
			switch(rta->rta_type) {

			case CGW_FILTER:
				printfilter(RTA_DATA(rta));
				break;

			case CGW_MOD_AND:
				printmod("AND", RTA_DATA(rta));
				break;

			case CGW_MOD_OR:
				printmod("OR", RTA_DATA(rta));
				break;

			case CGW_MOD_XOR:
				printmod("XOR", RTA_DATA(rta));
				break;

			case CGW_MOD_SET:
				printmod("SET", RTA_DATA(rta));
				break;

			case CGW_FDMOD_AND:
				printfdmod("AND", RTA_DATA(rta));
				break;

			case CGW_FDMOD_OR:
				printfdmod("OR", RTA_DATA(rta));
				break;

			case CGW_FDMOD_XOR:
				printfdmod("XOR", RTA_DATA(rta));
				break;

			case CGW_FDMOD_SET:
				printfdmod("SET", RTA_DATA(rta));
				break;

			case CGW_MOD_UID:
				printf("-u %X ", *(__u32 *)RTA_DATA(rta));
				break;

			case CGW_LIM_HOPS:
				printf("-l %d ", *(__u8 *)RTA_DATA(rta));
				break;

			case CGW_CS_XOR:
				print_cs_xor((struct cgw_csum_xor *)RTA_DATA(rta));
				break;

			case CGW_CS_CRC8:
				print_cs_crc8((struct cgw_csum_crc8 *)RTA_DATA(rta));
				break;

			case CGW_SRC_IF:
			case CGW_DST_IF:
			case CGW_HANDLED:
			case CGW_DROPPED:
			case CGW_DELETED:
				break;

			default:
				printf("Unknown attribute %d!", rta->rta_type);
				return -EINVAL;
				break;
			}
		}

		/* end of entry */
		printf("# %d handled %d dropped %d deleted\n",
		       handled, dropped, deleted);

		/* jump to next NLMSG in the given buffer */
		nlh = NLMSG_NEXT(nlh, len);
	}
}